

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

bool closeEnough(string *reference,string *attempt,uint minLength)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  string local_48 [36];
  uint local_24;
  string *psStack_20;
  uint minLength_local;
  string *attempt_local;
  string *reference_local;
  
  local_24 = minLength;
  psStack_20 = attempt;
  attempt_local = reference;
  bVar2 = compare(reference,attempt,false);
  if (bVar2) {
    reference_local._7_1_ = 1;
  }
  else {
    uVar3 = std::__cxx11::string::length();
    uVar4 = std::__cxx11::string::length();
    if (uVar3 < uVar4) {
      uVar3 = std::__cxx11::string::length();
      psVar1 = attempt_local;
      if (local_24 <= uVar3) {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_48,(ulong)psVar1);
        reference_local._7_1_ = compare(local_48,psStack_20,false);
        std::__cxx11::string::~string((string *)local_48);
        goto LAB_0017fca9;
      }
    }
    reference_local._7_1_ = 0;
  }
LAB_0017fca9:
  return (bool)(reference_local._7_1_ & 1);
}

Assistant:

bool closeEnough (
  const std::string& reference,
  const std::string& attempt,
  unsigned int minLength /* = 0 */)
{
  // An exact match is accepted first.
  if (compare (reference, attempt, false))
    return true;

  // A partial match will suffice.
  if (attempt.length () < reference.length () &&
      attempt.length () >= minLength)
    return compare (reference.substr (0, attempt.length ()), attempt, false);

  return false;
}